

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImGuiSettingsHandler *pIVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  long lVar6;
  int iVar7;
  ImGuiContext *ctx;
  byte bVar8;
  
  pIVar3 = GImGui;
  bVar8 = 0;
  pIVar4 = FindSettingsHandler(handler->TypeName);
  if (pIVar4 == (ImGuiSettingsHandler *)0x0) {
    iVar7 = (pIVar3->SettingsHandlers).Size;
    iVar2 = (pIVar3->SettingsHandlers).Capacity;
    if (iVar7 == iVar2) {
      iVar7 = iVar7 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar2 < iVar7) {
        if (pIVar3 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiSettingsHandler *)
                 (*GImAllocatorAllocFunc)((long)iVar7 * 0x48,GImAllocatorUserData);
        pIVar4 = (pIVar3->SettingsHandlers).Data;
        if (pIVar4 != (ImGuiSettingsHandler *)0x0) {
          memcpy(__dest,pIVar4,(long)(pIVar3->SettingsHandlers).Size * 0x48);
          pIVar4 = (pIVar3->SettingsHandlers).Data;
          if ((pIVar4 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar3->SettingsHandlers).Data = __dest;
        (pIVar3->SettingsHandlers).Capacity = iVar7;
      }
    }
    pIVar4 = (pIVar3->SettingsHandlers).Data + (pIVar3->SettingsHandlers).Size;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      pIVar4->TypeName = handler->TypeName;
      handler = (ImGuiSettingsHandler *)((long)handler + (ulong)bVar8 * -0x10 + 8);
      pIVar4 = (ImGuiSettingsHandler *)((long)pIVar4 + (ulong)bVar8 * -0x10 + 8);
    }
    (pIVar3->SettingsHandlers).Size = (pIVar3->SettingsHandlers).Size + 1;
    return;
  }
  __assert_fail("FindSettingsHandler(handler->TypeName) == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x3004,"void ImGui::AddSettingsHandler(const ImGuiSettingsHandler *)");
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}